

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O3

void getHighsNonVertexSolution
               (HighsOptions *options,HighsLp *lp,Int num_col,Int num_row,
               vector<double,_std::allocator<double>_> *rhs,
               vector<char,_std::allocator<char>_> *constraint_type,LpSolver *lps,
               HighsModelStatus model_status,HighsSolution *highs_solution)

{
  size_type __n;
  allocator_type local_f9;
  HighsOptions *local_f8;
  HighsLp *local_f0;
  vector<double,_std::allocator<double>_> *local_e8;
  vector<char,_std::allocator<char>_> *local_e0;
  vector<double,_std::allocator<double>_> zl;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> slack;
  vector<double,_std::allocator<double>_> zu;
  vector<double,_std::allocator<double>_> xu;
  vector<double,_std::allocator<double>_> xl;
  vector<double,_std::allocator<double>_> x;
  
  __n = (size_type)num_col;
  local_f8 = options;
  local_f0 = lp;
  local_e8 = rhs;
  local_e0 = constraint_type;
  std::vector<double,_std::allocator<double>_>::vector(&x,__n,(allocator_type *)&xl);
  std::vector<double,_std::allocator<double>_>::vector(&xl,__n,(allocator_type *)&xu);
  std::vector<double,_std::allocator<double>_>::vector(&xu,__n,(allocator_type *)&zl);
  std::vector<double,_std::allocator<double>_>::vector(&zl,__n,(allocator_type *)&zu);
  std::vector<double,_std::allocator<double>_>::vector(&zu,__n,(allocator_type *)&slack);
  std::vector<double,_std::allocator<double>_>::vector(&slack,(long)num_row,(allocator_type *)&y);
  std::vector<double,_std::allocator<double>_>::vector(&y,(long)num_row,&local_f9);
  ipx::LpSolver::GetInteriorSolution
            (lps,x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
             xl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,xu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
             slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
             zu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start);
  ipxSolutionToHighsSolution
            (local_f8,local_f0,local_e8,local_e0,num_col,num_row,&x,&slack,&y,&zl,&zu,model_status,
             highs_solution);
  if (y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(slack.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (zu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(zu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(zl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (xu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(xu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (xl.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(xl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getHighsNonVertexSolution(const HighsOptions& options, const HighsLp& lp,
                               const ipx::Int num_col, const ipx::Int num_row,
                               const std::vector<double>& rhs,
                               const std::vector<char>& constraint_type,
                               const ipx::LpSolver& lps,
                               const HighsModelStatus model_status,
                               HighsSolution& highs_solution) {
  // Get the interior solution (available if IPM was started).
  // GetInteriorSolution() returns the final IPM iterate, regardless if the
  // IPM terminated successfully or not. (Only in case of out-of-memory no
  // solution exists.)
  std::vector<double> x(num_col);
  std::vector<double> xl(num_col);
  std::vector<double> xu(num_col);
  std::vector<double> zl(num_col);
  std::vector<double> zu(num_col);
  std::vector<double> slack(num_row);
  std::vector<double> y(num_row);

  lps.GetInteriorSolution(x.data(), xl.data(), xu.data(), slack.data(),
                          y.data(), zl.data(), zu.data());

  ipxSolutionToHighsSolution(options, lp, rhs, constraint_type, num_col,
                             num_row, x, slack, y, zl, zu, model_status,
                             highs_solution);
}